

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_late_unknown_options_no_fail(void)

{
  char *pcVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  cargo_t cargo;
  size_t unknown_count_cpy;
  int b;
  int a;
  size_t unknown_count;
  char **unknowns_cpy;
  char *args [7];
  
  iVar2 = cargo_init(&cargo,0,"program");
  if (iVar2 == 0) {
    args[6] = "3";
    args[4] = "--delta";
    args[5] = "--beta";
    args[2] = "123";
    args[3] = "--centauri";
    a = 0;
    b = 0;
    unknown_count = 0;
    args[0] = "program";
    args[1] = "--alpha";
    unknowns_cpy = (char **)0x0;
    unknown_count_cpy = 0;
    cargo_set_flags(cargo,CARGO_NO_FAIL_UNKNOWN);
    cargo_add_option(cargo,0,"--alpha","an option","i",&a);
    iVar2 = cargo_add_option(cargo,0,"--beta -b","an option","i",&b);
    if (iVar2 == 0) {
      iVar2 = cargo_parse(cargo,0,1,7,args);
      if (iVar2 == 0) {
        printf("a = %d\n",(ulong)(uint)a);
        printf("b = %d\n",(ulong)(uint)b);
        if (a == 0x7b) {
          if (b == 3) {
            ppcVar3 = cargo_get_unknown(cargo,&unknown_count);
            if (ppcVar3 == (char **)0x0) {
              pcVar4 = "Got NULL unknowns list";
            }
            else {
              for (uVar5 = 0; uVar5 < unknown_count; uVar5 = uVar5 + 1) {
                puts(ppcVar3[uVar5]);
              }
              puts("Check that \"unknowns\" has expected_count elements");
              if (unknown_count == 2) {
                puVar6 = &DAT_001307c0;
                pcVar4 = "Array contains unexpected value";
                uVar5 = 0;
LAB_0011b273:
                if (uVar5 < unknown_count) goto code_r0x0011b27a;
                ppcVar3 = cargo_get_unknown_copy(cargo,&unknown_count_cpy);
                unknowns_cpy = ppcVar3;
                if (ppcVar3 == (char **)0x0) {
                  pcVar4 = "Got NULL unknowns list (copy)";
                }
                else {
                  for (uVar5 = 0; uVar5 < unknown_count_cpy; uVar5 = uVar5 + 1) {
                    puts(ppcVar3[uVar5]);
                  }
                  puts("Check that \"unknowns_cpy\" has expected_count elements");
                  if (unknown_count_cpy == 2) {
                    puVar6 = &DAT_001307c0;
                    uVar5 = 0;
                    do {
                      if (unknown_count_cpy <= uVar5) {
                        pcVar4 = (char *)0x0;
                        break;
                      }
                      pcVar1 = (char *)*puVar6;
                      printf("  %lu: \"%s\" -> \"%s\"\n",uVar5 + 1,ppcVar3[uVar5],pcVar1);
                      iVar2 = strcmp(ppcVar3[uVar5],pcVar1);
                      puVar6 = puVar6 + 1;
                      uVar5 = uVar5 + 1;
                    } while (iVar2 == 0);
                  }
                  else {
                    pcVar4 = 
                    "unknowns_cpy array count unknown_count_cpy is not expected expected_count";
                  }
                }
                goto LAB_0011b2c4;
              }
              pcVar4 = "unknowns array count unknown_count is not expected expected_count";
            }
          }
          else {
            pcVar4 = "b != 3 after unknown option (check after)";
          }
        }
        else {
          pcVar4 = "a != 123 after unknown option (check after)";
        }
      }
      else {
        pcVar4 = "Parse failure on unknown option (late, no fail)";
      }
    }
    else {
      pcVar4 = "Failed to add options";
    }
LAB_0011b2c4:
    cargo_free_commandline(&unknowns_cpy,(int)unknown_count_cpy);
    cargo_destroy(&cargo);
  }
  else {
    pcVar4 = "Failed to init cargo";
  }
  return pcVar4;
code_r0x0011b27a:
  pcVar1 = (char *)*puVar6;
  printf("  %lu: \"%s\" -> \"%s\"\n",uVar5 + 1,ppcVar3[uVar5],pcVar1);
  iVar2 = strcmp(ppcVar3[uVar5],pcVar1);
  puVar6 = puVar6 + 1;
  uVar5 = uVar5 + 1;
  if (iVar2 != 0) goto LAB_0011b2c4;
  goto LAB_0011b273;
}

Assistant:

_TEST_START(TEST_late_unknown_options_no_fail)
{
    char *args[] =
    {
        "program", "--alpha", "123", "--centauri", "--delta", "--beta", "3"
    };
    char *expected[] = { "--centauri", "--delta" };
    size_t expected_count = sizeof(expected) / sizeof(expected[0]);
    int a = 0;
    int b = 0;
    size_t i = 0;
    const char **unknowns = NULL;
    size_t unknown_count = 0;
    char **unknowns_cpy = NULL;
    size_t unknown_count_cpy = 0;

    cargo_set_flags(cargo, CARGO_NO_FAIL_UNKNOWN);

    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i", &a);
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failure on unknown option (late, no fail)");

    printf("a = %d\n", a);
    printf("b = %d\n", b);
    cargo_assert(a == 123, "a != 123 after unknown option (check after)");
    cargo_assert(b == 3,   "b != 3 after unknown option (check after)");

    unknowns = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknowns, "Got NULL unknowns list");
    for (i = 0; i < unknown_count; i++) printf("%s\n", unknowns[i]);
    cargo_assert_str_array(unknown_count, expected_count, unknowns, expected);

    unknowns_cpy = cargo_get_unknown_copy(cargo, &unknown_count_cpy);
    cargo_assert(unknowns_cpy, "Got NULL unknowns list (copy)");
    for (i = 0; i < unknown_count_cpy; i++) printf("%s\n", unknowns_cpy[i]);
    cargo_assert_str_array(unknown_count_cpy, expected_count, unknowns_cpy, expected);

    _TEST_CLEANUP();
    cargo_free_commandline(&unknowns_cpy, unknown_count_cpy);
}